

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int stat4ValueFromExpr(Parse *pParse,Expr *pExpr,u8 affinity,ValueNewStat4Ctx *pAlloc,
                      sqlite3_value **ppVal)

{
  short sVar1;
  sqlite3 *db_00;
  Expr *pEVar2;
  undefined8 uVar3;
  int iBindVar;
  Vdbe *v;
  sqlite3 *db;
  sqlite3_value *pVal;
  sqlite3_value **ppsStack_30;
  int rc;
  sqlite3_value **ppVal_local;
  ValueNewStat4Ctx *pAlloc_local;
  Expr *pEStack_18;
  u8 affinity_local;
  Expr *pExpr_local;
  Parse *pParse_local;
  
  pVal._4_4_ = 0;
  db = (sqlite3 *)0x0;
  db_00 = pParse->db;
  ppsStack_30 = ppVal;
  ppVal_local = (sqlite3_value **)pAlloc;
  pAlloc_local._7_1_ = affinity;
  pEStack_18 = pExpr;
  pExpr_local = (Expr *)pParse;
  pEStack_18 = sqlite3ExprSkipCollate(pExpr);
  if (pEStack_18 == (Expr *)0x0) {
    db = (sqlite3 *)valueNew(db_00,(ValueNewStat4Ctx *)ppVal_local);
    if (db != (sqlite3 *)0x0) {
      sqlite3VdbeMemSetNull((Mem *)db);
    }
  }
  else if ((pEStack_18->op == 0x94) && ((db_00->flags & 0x800000) == 0)) {
    sVar1 = pEStack_18->iColumn;
    sqlite3VdbeSetVarmask((Vdbe *)pExpr_local->pLeft,(int)sVar1);
    pEVar2 = pExpr_local[4].pLeft;
    if ((pEVar2 != (Expr *)0x0) &&
       (db = (sqlite3 *)valueNew(db_00,(ValueNewStat4Ctx *)ppVal_local), db != (sqlite3 *)0x0)) {
      pVal._4_4_ = sqlite3VdbeMemCopy((Mem *)db,
                                      (Mem *)(&(pEVar2[1].pAggInfo)->directMode +
                                             (long)(sVar1 + -1) * 0x38));
      sqlite3ValueApplyAffinity((sqlite3_value *)db,pAlloc_local._7_1_,db_00->enc);
      uVar3._0_1_ = pExpr_local->op;
      uVar3._1_1_ = pExpr_local->affinity;
      uVar3._2_2_ = *(undefined2 *)&pExpr_local->field_0x2;
      uVar3._4_4_ = pExpr_local->flags;
      db->nDb = (int)uVar3;
      db->mDbFlags = (int)((ulong)uVar3 >> 0x20);
    }
  }
  else {
    pVal._4_4_ = valueFromExpr(db_00,pEStack_18,db_00->enc,pAlloc_local._7_1_,(sqlite3_value **)&db,
                               (ValueNewStat4Ctx *)ppVal_local);
  }
  *ppsStack_30 = (sqlite3_value *)db;
  return pVal._4_4_;
}

Assistant:

static int stat4ValueFromExpr(
  Parse *pParse,                  /* Parse context */
  Expr *pExpr,                    /* The expression to extract a value from */
  u8 affinity,                    /* Affinity to use */
  struct ValueNewStat4Ctx *pAlloc,/* How to allocate space.  Or NULL */
  sqlite3_value **ppVal           /* OUT: New value object (or NULL) */
){
  int rc = SQLITE_OK;
  sqlite3_value *pVal = 0;
  sqlite3 *db = pParse->db;

  /* Skip over any TK_COLLATE nodes */
  pExpr = sqlite3ExprSkipCollate(pExpr);

  assert( pExpr==0 || pExpr->op!=TK_REGISTER || pExpr->op2!=TK_VARIABLE );
  if( !pExpr ){
    pVal = valueNew(db, pAlloc);
    if( pVal ){
      sqlite3VdbeMemSetNull((Mem*)pVal);
    }
  }else if( pExpr->op==TK_VARIABLE && (db->flags & SQLITE_EnableQPSG)==0 ){
    Vdbe *v;
    int iBindVar = pExpr->iColumn;
    sqlite3VdbeSetVarmask(pParse->pVdbe, iBindVar);
    if( (v = pParse->pReprepare)!=0 ){
      pVal = valueNew(db, pAlloc);
      if( pVal ){
        rc = sqlite3VdbeMemCopy((Mem*)pVal, &v->aVar[iBindVar-1]);
        sqlite3ValueApplyAffinity(pVal, affinity, ENC(db));
        pVal->db = pParse->db;
      }
    }
  }else{
    rc = valueFromExpr(db, pExpr, ENC(db), affinity, &pVal, pAlloc);
  }

  assert( pVal==0 || pVal->db==db );
  *ppVal = pVal;
  return rc;
}